

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void FStat::PrintStat(void)

{
  FFont *font;
  DFrameBuffer *this;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint local_38;
  uint i;
  FString local_28;
  FString stattext;
  FStat *stat;
  int local_10;
  int count;
  int y;
  int fontheight;
  
  iVar1 = FFont::GetHeight(ConFont);
  local_10 = DCanvas::GetHeight((DCanvas *)screen);
  stat._4_4_ = 0;
  for (stattext.Chars = (char *)FirstStat; stattext.Chars != (char *)0x0;
      stattext.Chars = stattext.Chars[8]) {
    if ((stattext.Chars[0x18] & 1U) != 0) {
      (**(code **)(*(long *)stattext.Chars + 0x10))();
      sVar2 = FString::Len(&local_28);
      if (sVar2 != 0) {
        local_10 = local_10 - (iVar1 + 1);
        local_38 = 0;
        while( true ) {
          sVar2 = FString::Len(&local_28);
          this = screen;
          font = ConFont;
          if (sVar2 - 1 <= (ulong)local_38) break;
          pcVar3 = FString::operator[](&local_28,local_38);
          if (*pcVar3 == '\n') {
            local_10 = local_10 - (iVar1 + 1);
          }
          local_38 = local_38 + 1;
        }
        pcVar3 = FString::operator_cast_to_char_(&local_28);
        DCanvas::DrawText((DCanvas *)this,font,3,5,local_10,pcVar3,0);
        stat._4_4_ = stat._4_4_ + 1;
      }
      FString::~FString(&local_28);
    }
  }
  if (stat._4_4_ != 0) {
    ST_SetNeedRefresh();
  }
  return;
}

Assistant:

void FStat::PrintStat ()
{
	int fontheight = ConFont->GetHeight() + 1;
	int y = SCREENHEIGHT;
	int count = 0;

	for (FStat *stat = FirstStat; stat != NULL; stat = stat->m_Next)
	{
		if (stat->m_Active)
		{
			FString stattext(stat->GetStats());

			if (stattext.Len() > 0)
			{
				y -= fontheight;	// there's at least one line of text
				for (unsigned i = 0; i < stattext.Len()-1; i++)
				{
					// Count number of linefeeds but ignore terminating ones.
					if (stattext[i] == '\n') y -= fontheight;
				}
				screen->DrawText(ConFont, CR_GREEN, 5, y, stattext, TAG_DONE);
				count++;
			}
		}
	}
	if (count)
	{
		ST_SetNeedRefresh();
	}
}